

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ConvolutionParameter::SharedCtor(ConvolutionParameter *this)

{
  ConvolutionParameter *this_local;
  
  this->_cached_size_ = 0;
  memset(&this->weight_filler_,0,0x31);
  this->axis_ = 1;
  this->bias_term_ = true;
  this->group_ = 1;
  return;
}

Assistant:

void ConvolutionParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&weight_filler_, 0, reinterpret_cast<char*>(&force_nd_im2col_) -
    reinterpret_cast<char*>(&weight_filler_) + sizeof(force_nd_im2col_));
  axis_ = 1;
  bias_term_ = true;
  group_ = 1u;
}